

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse::addRef
          (LocallyRedirectedRpcResponse *this)

{
  RpcResponse *extraout_RDX;
  LocallyRedirectedRpcResponse *in_RSI;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> OVar1;
  LocallyRedirectedRpcResponse *this_local;
  
  this_local = this;
  kj::addRef<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse>
            ((kj *)&stack0xffffffffffffffd8,in_RSI);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>::
  Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,void>
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)> *)this
             ,(Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
               *)&stack0xffffffffffffffd8);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
  ::~Own((Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
          *)&stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<RpcResponse> addRef() override {
      return kj::addRef(*this);
    }